

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall cs::instance_type::interpret(instance_type *this)

{
  bool bVar1;
  long in_RDI;
  lang_error *le;
  exception *e;
  exception *e_1;
  statement_base **ptr;
  iterator __end1;
  iterator __begin1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range1;
  _Self *in_stack_fffffffffffffe98;
  _Self *in_stack_fffffffffffffea0;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**> local_30;
  long local_10;
  
  local_10 = in_RDI + 0xb8;
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_fffffffffffffe98);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_fffffffffffffe98);
  while( true ) {
    bVar1 = std::operator!=(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    if (!bVar1) break;
    std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
    operator*(&local_30);
    statement_base::run((statement_base *)in_stack_fffffffffffffea0);
    std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
    operator++(in_stack_fffffffffffffea0);
  }
  return;
}

Assistant:

void instance_type::interpret()
	{
		// Run the instruction
		for (auto &ptr: statements) {
			try {
				ptr->run();
			}
			catch (const lang_error &le) {
				throw fatal_error(std::string("Uncaught exception: ") + le.what());
			}
			catch (const cs::exception &e) {
				throw e;
			}
			catch (const std::exception &e) {
				throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
			}
		}
	}